

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t XXH3_len_1to3_128b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  XXH128_hash_t XVar1;
  uint x;
  xxh_u32 xVar2;
  xxh_u32 xVar3;
  xxh_u32 xVar4;
  xxh_u32 xVar5;
  xxh_u32 xVar6;
  xxh_u64 xVar7;
  xxh_u64 xVar8;
  long in_RCX;
  ulong in_RSI;
  byte *in_RDI;
  xxh_u64 keyed_hi;
  xxh_u64 keyed_lo;
  xxh_u64 bitfliph;
  xxh_u64 bitflipl;
  xxh_u32 combinedh;
  xxh_u32 combinedl;
  xxh_u8 c3;
  xxh_u8 c2;
  xxh_u8 c1;
  XXH128_hash_t h128;
  int local_20;
  
  local_20 = (int)in_RSI;
  x = (uint)*in_RDI << 0x10 | (uint)in_RDI[in_RSI >> 1] << 0x18 | (uint)in_RDI[in_RSI - 1] |
      local_20 << 8;
  xVar2 = XXH_swap32(x);
  xVar3 = XXH_readLE32((void *)0x10bc4c);
  xVar4 = XXH_readLE32((void *)0x10bc5e);
  xVar5 = XXH_readLE32((void *)0x10bc81);
  xVar6 = XXH_readLE32((void *)0x10bc93);
  xVar7 = XXH64_avalanche((ulong)x ^ (ulong)(xVar3 ^ xVar4) + in_RCX);
  xVar8 = XXH64_avalanche((ulong)(xVar2 << 0xd | xVar2 >> 0x13) ^ (ulong)(xVar5 ^ xVar6) - in_RCX);
  XVar1.high64 = xVar8;
  XVar1.low64 = xVar7;
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH_PUREF XXH128_hash_t
XXH3_len_1to3_128b(const xxh_u8* input, size_t len, const xxh_u8* secret, XXH64_hash_t seed)
{
    /* A doubled version of 1to3_64b with different constants. */
    XXH_ASSERT(input != NULL);
    XXH_ASSERT(1 <= len && len <= 3);
    XXH_ASSERT(secret != NULL);
    /*
     * len = 1: combinedl = { input[0], 0x01, input[0], input[0] }
     * len = 2: combinedl = { input[1], 0x02, input[0], input[1] }
     * len = 3: combinedl = { input[2], 0x03, input[0], input[1] }
     */
    {   xxh_u8 const c1 = input[0];
        xxh_u8 const c2 = input[len >> 1];
        xxh_u8 const c3 = input[len - 1];
        xxh_u32 const combinedl = ((xxh_u32)c1 <<16) | ((xxh_u32)c2 << 24)
                                | ((xxh_u32)c3 << 0) | ((xxh_u32)len << 8);
        xxh_u32 const combinedh = XXH_rotl32(XXH_swap32(combinedl), 13);
        xxh_u64 const bitflipl = (XXH_readLE32(secret) ^ XXH_readLE32(secret+4)) + seed;
        xxh_u64 const bitfliph = (XXH_readLE32(secret+8) ^ XXH_readLE32(secret+12)) - seed;
        xxh_u64 const keyed_lo = (xxh_u64)combinedl ^ bitflipl;
        xxh_u64 const keyed_hi = (xxh_u64)combinedh ^ bitfliph;
        XXH128_hash_t h128;
        h128.low64  = XXH64_avalanche(keyed_lo);
        h128.high64 = XXH64_avalanche(keyed_hi);
        return h128;
    }
}